

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O3

bool __thiscall
ctemplate::SectionTemplateNode::AddVariableNode
          (SectionTemplateNode *this,TemplateToken *token,Template *my_template)

{
  size_t *psVar1;
  TemplateContext TVar2;
  HtmlParser *htmlparser;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  VariableTemplateNode *this_00;
  _List_node_base *p_Var7;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  modvals;
  string error_msg;
  string variable_name;
  vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  local_a8;
  vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  local_88;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (token == (TemplateToken *)0x0) {
    __assert_fail("token",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                  ,0x62e,
                  "bool ctemplate::SectionTemplateNode::AddVariableNode(TemplateToken *, Template *)"
                 );
  }
  TVar2 = my_template->initial_context_;
  bVar10 = true;
  if (TVar2 == TC_MANUAL) goto LAB_0011abac;
  htmlparser = my_template->htmlparser_;
  local_50[0] = &local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,token->text,token->text + token->textlen);
  iVar4 = std::__cxx11::string::compare((char *)local_50);
  if (iVar4 == 0) {
LAB_0011a941:
    bVar10 = true;
    if (TVar2 - TC_HTML < 3) {
      if (htmlparser == (HtmlParser *)0x0) {
        __assert_fail("htmlparser",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                      ,0x63e,
                      "bool ctemplate::SectionTemplateNode::AddVariableNode(TemplateToken *, Template *)"
                     );
      }
      iVar4 = ctemplate_htmlparser::htmlparser_state(htmlparser->parser_);
      if (iVar4 != 7) {
        iVar4 = std::__cxx11::string::compare((char *)local_50);
        pcVar9 = "\n";
        if (iVar4 == 0) {
          pcVar9 = " ";
        }
        pcVar8 = "";
        if (iVar4 == 0) {
          pcVar8 = "";
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar9,pcVar8);
        iVar4 = ctemplate_htmlparser::htmlparser_parse
                          (htmlparser->parser_,local_70._M_dataplus._M_p,
                           (int)local_70._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (iVar4 != 7) goto LAB_0011ab98;
      }
      bVar10 = false;
    }
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)local_50);
    if (iVar4 == 0) goto LAB_0011a941;
    local_70._M_dataplus._M_p = (pointer)local_50[0];
    bVar3 = std::binary_search<char_const*const*,char_const*,ctemplate::StringHash>
                      (&Template::kSafeWhitelistedVariables,&vtable);
    bVar10 = true;
    if (!bVar3) {
      local_a8.
      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.
      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.
      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      if (TVar2 == TC_CSS) {
        if (htmlparser == (HtmlParser *)0x0) {
          __assert_fail("htmlparser",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                        ,0x216,
                        "const vector<const ModifierAndValue *> ctemplate::(anonymous namespace)::GetModifierForContext(TemplateContext, HtmlParser *, const Template *)"
                       );
        }
        GetModifierForCss(&local_88,htmlparser,&local_70);
      }
      else if (TVar2 == TC_JSON) {
        GetModifierForJson(&local_88,htmlparser,&local_70);
      }
      else if (TVar2 == TC_XML) {
        GetModifierForXml(&local_88,htmlparser,&local_70);
      }
      else {
        if (2 < TVar2 - TC_HTML) {
          __assert_fail("AUTO_ESCAPE_PARSING_CONTEXT(my_context)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                        ,0x21b,
                        "const vector<const ModifierAndValue *> ctemplate::(anonymous namespace)::GetModifierForContext(TemplateContext, HtmlParser *, const Template *)"
                       );
        }
        if (htmlparser == (HtmlParser *)0x0) {
          __assert_fail("htmlparser",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                        ,0x21c,
                        "const vector<const ModifierAndValue *> ctemplate::(anonymous namespace)::GetModifierForContext(TemplateContext, HtmlParser *, const Template *)"
                       );
        }
        GetModifierForHtmlJs(&local_88,htmlparser,&local_70);
      }
      local_a8.
      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_88.
           super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_a8.
      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_88.
           super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_a8.
      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_88.
           super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_88.
          super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_88.
          super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Template ",9);
        pcVar9 = (my_template->resolved_filename_)._M_dataplus._M_p;
        if (pcVar9 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x150350);
        }
        else {
          sVar5 = strlen(pcVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Auto-Escape: ",0xd);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_70._M_dataplus._M_p,
                            local_70._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      bVar10 = local_88.
               super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_88.
               super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar10) {
        TemplateToken::UpdateModifier(token,&local_a8);
        local_88.
        super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_a8.
             super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      if (local_88.
          super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.
                        super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
LAB_0011ab98:
  if (local_50[0] != &local_40) {
    operator_delete(local_50[0]);
  }
LAB_0011abac:
  this_00 = (VariableTemplateNode *)operator_new(0x58);
  VariableTemplateNode::VariableTemplateNode(this_00,token);
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = (_List_node_base *)this_00;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  psVar1 = &(this->node_list_).
            super__List_base<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return bVar10;
}

Assistant:

bool SectionTemplateNode::AddVariableNode(TemplateToken* token,
                                          Template* my_template) {
  assert(token);
  bool success = true;
  HtmlParser *htmlparser = my_template->htmlparser_;
  TemplateContext initial_context = my_template->initial_context_;

  if (AUTO_ESCAPE_MODE(initial_context)) {
    // Determines modifiers for the variable in auto escape mode.
    string variable_name(token->text, token->textlen);
    // We declare in the documentation that if the user changes the
    // value of these variables, they must only change it to a value
    // that's "equivalent" from the point of view of an html parser.
    // So it's ok to hard-code in that these are " " and "\n",
    // respectively, even though in theory the user could change them
    // (to say, BI_NEWLINE == "\r\n").
    if (variable_name == "BI_SPACE" || variable_name == "BI_NEWLINE") {
      if (AUTO_ESCAPE_PARSING_CONTEXT(initial_context)) {
        assert(htmlparser);
        if (htmlparser->state() == HtmlParser::STATE_ERROR ||
            htmlparser->Parse(variable_name == "BI_SPACE" ? " " : "\n") ==
            HtmlParser::STATE_ERROR)
          success = false;
      }
    } else if (binary_search(Template::kSafeWhitelistedVariables,
                             Template::kSafeWhitelistedVariables +
                             arraysize(Template::kSafeWhitelistedVariables),
                             variable_name.c_str(),
                             // Luckily, StringHash(a, b) is defined as "a < b"
                             StringHash())) {
      // Do not escape the variable, it is whitelisted.
    } else {
      vector<const ModifierAndValue*> modvals =
          GetModifierForContext(initial_context, htmlparser, my_template);
      // There should always be at least one modifier in any Auto-Escape mode.
      if (modvals.empty())
        success = false;
      else
        token->UpdateModifier(modvals);
    }
  }
  node_list_.push_back(new VariableTemplateNode(*token));
  return success;
}